

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O3

int session_handle_invalid_connection
              (nghttp2_session *session,nghttp2_frame *frame,int lib_error_code,char *reason)

{
  nghttp2_on_invalid_frame_recv_callback p_Var1;
  int iVar2;
  uint32_t error_code;
  
  p_Var1 = (session->callbacks).on_invalid_frame_recv_callback;
  if (p_Var1 != (nghttp2_on_invalid_frame_recv_callback)0x0) {
    iVar2 = (*p_Var1)(session,frame,lib_error_code,session->user_data);
    if (iVar2 != 0) {
      return -0x386;
    }
  }
  error_code = get_error_code_from_lib_error_code(lib_error_code);
  iVar2 = session_terminate_session(session,session->last_proc_stream_id,error_code,reason);
  return iVar2;
}

Assistant:

static int session_handle_invalid_connection(nghttp2_session *session,
                                             nghttp2_frame *frame,
                                             int lib_error_code,
                                             const char *reason) {
  if (session->callbacks.on_invalid_frame_recv_callback) {
    if (session->callbacks.on_invalid_frame_recv_callback(
            session, frame, lib_error_code, session->user_data) != 0) {
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    }
  }
  return nghttp2_session_terminate_session_with_reason(
      session, get_error_code_from_lib_error_code(lib_error_code), reason);
}